

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TParseContext::handleDotDereference
          (TParseContext *this,TSourceLoc *loc,TIntermTyped *base,TString *field)

{
  EShSource EVar1;
  TIntermediate *pTVar2;
  pointer pTVar3;
  TString name;
  TString name_00;
  TString structName_00;
  TString structName_01;
  bool bVar4;
  int iVar5;
  int iVar6;
  TIntermTyped *pTVar7;
  undefined4 extraout_var;
  TIntermTyped *pTVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TTypeList *pTVar9;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar10;
  undefined4 extraout_var_05;
  long *plVar11;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  long lVar12;
  undefined4 extraout_var_10;
  TIntermConstantUnion *index;
  undefined4 extraout_var_11;
  TParseContext *this_01;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  long lVar13;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  pointer pcVar14;
  TString *pTVar15;
  char *pcVar16;
  pointer pcVar17;
  _func_int **pp_Var18;
  char *pcVar19;
  long lVar20;
  undefined8 in_stack_fffffffffffffe68;
  pool_allocator<char> local_180;
  pool_allocator<char> local_178;
  TIntermTyped *base_local;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  local_168 [2];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_140 [40];
  TString structName;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_80 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_58 [40];
  TType *this_00;
  undefined4 extraout_var_06;
  undefined4 extraout_var_12;
  
  base_local = base;
  variableCheck(this,&base_local);
  bVar4 = std::operator==(field,"length");
  pTVar7 = base_local;
  iVar5 = (*(base_local->super_TIntermNode)._vptr_TIntermNode[0x2a])(base_local);
  if (!bVar4) {
    if ((char)iVar5 == '\0') {
      iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7);
      if ((*(byte *)(CONCAT44(extraout_var,iVar5) + 10) & 0x60) == 0) {
        iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x2b])(pTVar7);
        if ((((char)iVar5 == '\0') &&
            (iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x2c])(pTVar7),
            (char)iVar5 == '\0')) ||
           ((iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x2e])(pTVar7),
            (char)iVar5 == '\0' &&
            ((iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x2f])(pTVar7),
             (char)iVar5 == '\0' &&
             (iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar7), iVar5 != 0xc))
            )))) {
          iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x2d])(pTVar7);
          if (((char)iVar5 == '\0') &&
             (iVar5 = (*(pTVar7->type)._vptr_TType[7])(&pTVar7->type), iVar5 != 0x12)) {
            pcVar14 = (field->_M_dataplus)._M_p;
            iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7);
            pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            EVar1 = pTVar2->source;
            bVar4 = pTVar2->enhancedMsgs;
            local_178.allocator = GetThreadPoolAllocator();
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       local_168[0]._M_local_buf,"",&local_178);
            local_180.allocator = GetThreadPoolAllocator();
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>(local_80,"",&local_180);
            name_00._M_dataplus._M_p = (pointer)local_80;
            name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_168;
            name_00._M_string_length = in_stack_fffffffffffffe68;
            name_00.field_2._M_allocated_capacity = (size_type)loc;
            name_00.field_2._8_8_ = pcVar14;
            structName_01._M_dataplus._M_p = (pointer)local_178.allocator;
            structName_01._M_dataplus.super_allocator_type.allocator = local_180.allocator;
            structName_01._M_string_length = (size_type)base_local;
            structName_01.field_2 = local_168[0];
            TType::getCompleteString
                      (&structName,(TType *)CONCAT44(extraout_var_10,iVar5),
                       (bool)(EVar1 == EShSourceGlsl & bVar4),true,true,true,name_00,structName_01);
            pp_Var18 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar16 = "does not apply to this type:";
            pcVar17 = structName._M_dataplus._M_p;
          }
          else {
            iVar5 = (*(pTVar7->type)._vptr_TType[7])(&pTVar7->type);
            iVar6 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7);
            this_00 = (TType *)CONCAT44(extraout_var_03,iVar6);
            if (iVar5 == 0x12) {
              iVar5 = (*this_00->_vptr_TType[0x15])(this_00);
              this_00 = (TType *)CONCAT44(extraout_var_04,iVar5);
            }
            pTVar9 = TType::getStruct(this_00);
            lVar20 = 0;
            for (lVar13 = 0;
                pTVar3 = (pTVar9->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ).
                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ._M_impl.super__Vector_impl_data._M_start, pTVar8 = pTVar7,
                lVar13 < (int)((ulong)((long)(pTVar9->
                                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                             ).
                                             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pTVar3) >> 5); lVar13 = lVar13 + 1) {
              pbVar10 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)(**(code **)(**(long **)((long)&pTVar3->type + lVar20) + 0x30))();
              pTVar15 = field;
              bVar4 = std::operator==(pbVar10,field);
              if (bVar4) {
                if ((((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan == 0)
                    || ((this->super_TParseContextBase).super_TParseVersions.spvVersion.
                        vulkanRelaxed != true)) ||
                   (pTVar8 = vkRelaxedRemapDotDereference
                                       (this,(TSourceLoc *)pTVar15,pTVar7,
                                        *(TType **)
                                         ((long)&((pTVar9->
                                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ).
                                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->type +
                                         lVar20),field), pTVar8 == pTVar7)) {
                  iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7);
                  lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar5) + 0x58))
                                     ((long *)CONCAT44(extraout_var_09,iVar5));
                  iVar5 = (int)lVar13;
                  if ((*(ulong *)(lVar12 + 8) & 0x10000007f) == 2) {
                    pTVar8 = TIntermediate::foldDereference
                                       ((this->super_TParseContextBase).super_TParseVersions.
                                        intermediate,pTVar7,iVar5,loc);
                  }
                  else {
                    blockMemberExtensionCheck(this,loc,pTVar7,iVar5,field);
                    index = TIntermediate::addConstantUnion
                                      ((this->super_TParseContextBase).super_TParseVersions.
                                       intermediate,iVar5,loc,false);
                    pTVar8 = TIntermediate::addIndex
                                       ((this->super_TParseContextBase).super_TParseVersions.
                                        intermediate,EOpIndexDirectStruct,pTVar7,
                                        &index->super_TIntermTyped,loc);
                    (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1d])
                              (pTVar8,*(undefined8 *)
                                       ((long)&((pTVar9->
                                                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                ).
                                                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->type +
                                       lVar20));
                    lVar13 = (**(code **)(**(long **)((long)&((pTVar9->
                                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ).
                                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->type +
                                                  lVar20) + 0x50))();
                    if (((*(uint *)(lVar13 + 8) & 0x7f) < 0x1f) &&
                       ((0x7ff00078U >> (*(uint *)(lVar13 + 8) & 0x1f) & 1) != 0)) {
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                      ::
                      _M_insert_unique<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&>
                                ((_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                                  *)&((this->super_TParseContextBase).super_TParseVersions.
                                     intermediate)->ioAccessed,field);
                    }
                  }
                }
                iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x21])(pTVar7);
                iVar6 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1f])(pTVar8);
                this_01 = (TParseContext *)CONCAT44(extraout_var_12,iVar6);
                iVar6 = (*(this_01->super_TParseContextBase).super_TParseVersions.
                          _vptr_TParseVersions[10])();
                inheritMemoryQualifiers
                          (this_01,(TQualifier *)CONCAT44(extraout_var_11,iVar5),
                           (TQualifier *)CONCAT44(extraout_var_13,iVar6));
                goto LAB_0039797a;
              }
              lVar20 = lVar20 + 0x20;
            }
            while (iVar5 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0xc])(pTVar8),
                  CONCAT44(extraout_var_05,iVar5) == 0) {
              iVar5 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[8])(pTVar8);
              plVar11 = (long *)CONCAT44(extraout_var_06,iVar5);
              if (plVar11 == (long *)0x0) break;
              pTVar8 = (TIntermTyped *)(**(code **)(*plVar11 + 400))(plVar11);
            }
            iVar5 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0xc])(pTVar8);
            if (CONCAT44(extraout_var_07,iVar5) == 0) {
              pcVar14 = (field->_M_dataplus)._M_p;
              pp_Var18 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
              pcVar17 = "";
            }
            else {
              structName._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
              structName._M_string_length = 0;
              structName.field_2._M_local_buf[0] = '\0';
              structName._M_dataplus._M_p = (pointer)&structName.field_2;
              pbVar10 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        append(&structName,"\'");
              iVar5 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0xc])(pTVar8);
              lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar5) + 400))
                                 ((long *)CONCAT44(extraout_var_08,iVar5));
              pbVar10 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        append(pbVar10,*(char **)(lVar13 + 8));
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                        (pbVar10,"\'");
              pcVar14 = (field->_M_dataplus)._M_p;
              pp_Var18 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
              pcVar17 = structName._M_dataplus._M_p;
            }
            pcVar16 = "no such field in structure";
          }
          (*pp_Var18[0x2d])(this,loc,pcVar16,pcVar14,pcVar17);
          pTVar8 = pTVar7;
        }
        else {
          pTVar8 = handleDotSwizzle(this,loc,pTVar7,field);
        }
LAB_0039797a:
        iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x21])(pTVar7);
        if ((*(byte *)(CONCAT44(extraout_var_14,iVar5) + 0xc) & 0x10) != 0) {
          iVar5 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1f])(pTVar8);
          lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar5) + 0x50))
                             ((long *)CONCAT44(extraout_var_15,iVar5));
          *(ulong *)(lVar13 + 8) = *(ulong *)(lVar13 + 8) | 0x1000000000;
          pTVar7 = base_local;
        }
        iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x21])(pTVar7);
        if ((*(byte *)(CONCAT44(extraout_var_16,iVar5) + 0xc) & 2) == 0) {
          return pTVar8;
        }
        iVar5 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1f])(pTVar8);
        lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar5) + 0x50))
                           ((long *)CONCAT44(extraout_var_17,iVar5));
        *(ulong *)(lVar13 + 8) = *(ulong *)(lVar13 + 8) | 0x200000000;
        return pTVar8;
      }
      structName._M_dataplus._M_p = (field->_M_dataplus)._M_p;
      pp_Var18 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar16 = "cannot apply to a cooperative matrix type:";
    }
    else {
      structName._M_dataplus._M_p = (field->_M_dataplus)._M_p;
      pp_Var18 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar16 = "cannot apply to an array:";
    }
    pcVar19 = ".";
LAB_00397479:
    (*pp_Var18[0x2d])(this,loc,pcVar16,pcVar19,structName._M_dataplus._M_p);
    return pTVar7;
  }
  if ((char)iVar5 == '\0') {
    iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x2b])(pTVar7);
    if (((char)iVar5 == '\0') &&
       (iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x29])(pTVar7), (char)iVar5 == '\0')
       ) {
      iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7);
      if (((*(byte *)(CONCAT44(extraout_var_00,iVar5) + 10) & 0x60) == 0) &&
         (iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7),
         (*(byte *)(CONCAT44(extraout_var_01,iVar5) + 0xb) & 8) == 0)) {
        pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        EVar1 = pTVar2->source;
        bVar4 = pTVar2->enhancedMsgs;
        pcVar19 = (field->_M_dataplus)._M_p;
        iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7);
        local_178.allocator = GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>(local_140,"",&local_178);
        local_180.allocator = GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>(local_58,"",&local_180);
        name._M_dataplus._M_p = (pointer)local_58;
        name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_140;
        name._M_string_length = in_stack_fffffffffffffe68;
        name.field_2._M_allocated_capacity = (size_type)loc;
        name.field_2._8_8_ = pcVar19;
        structName_00._M_dataplus._M_p = (pointer)local_178.allocator;
        structName_00._M_dataplus.super_allocator_type.allocator = local_180.allocator;
        structName_00._M_string_length = (size_type)base_local;
        structName_00.field_2 = local_168[0];
        TType::getCompleteString
                  (&structName,(TType *)CONCAT44(extraout_var_02,iVar5),
                   (bool)(EVar1 == EShSourceGlsl & bVar4),true,true,true,name,structName_00);
        pp_Var18 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar16 = "does not operate on this type:";
        goto LAB_00397479;
      }
      goto LAB_00397406;
    }
    pcVar19 = ".length() on vectors and matrices";
    iVar5 = -9;
    TParseVersions::requireProfile
              ((TParseVersions *)this,loc,-9,".length() on vectors and matrices");
    pcVar16 = "GL_ARB_shading_language_420pack";
    iVar6 = 0x1a4;
  }
  else {
    pcVar19 = ".length";
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,1,0x78,"GL_3DL_array_objects",".length");
    iVar5 = 8;
    iVar6 = 300;
    pcVar16 = (char *)0x0;
  }
  TParseVersions::profileRequires((TParseVersions *)this,loc,iVar5,iVar6,pcVar16,pcVar19);
LAB_00397406:
  pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  TType::TType((TType *)&structName,EbtInt,EvqTemporary,1,0,0,false);
  pTVar7 = TIntermediate::addMethod(pTVar2,pTVar7,(TType *)&structName,field,loc);
  return pTVar7;
}

Assistant:

TIntermTyped* TParseContext::handleDotDereference(const TSourceLoc& loc, TIntermTyped* base, const TString& field)
{
    variableCheck(base);

    //
    // .length() can't be resolved until we later see the function-calling syntax.
    // Save away the name in the AST for now.  Processing is completed in
    // handleLengthMethod().
    //
    if (field == "length") {
        if (base->isArray()) {
            profileRequires(loc, ENoProfile, 120, E_GL_3DL_array_objects, ".length");
            profileRequires(loc, EEsProfile, 300, nullptr, ".length");
        } else if (base->isVector() || base->isMatrix()) {
            const char* feature = ".length() on vectors and matrices";
            requireProfile(loc, ~EEsProfile, feature);
            profileRequires(loc, ~EEsProfile, 420, E_GL_ARB_shading_language_420pack, feature);
        } else if (!base->getType().isCoopMat() && !base->getType().isCoopVecNV()) {
            bool enhanced = intermediate.getEnhancedMsgs();
            error(loc, "does not operate on this type:", field.c_str(), base->getType().getCompleteString(enhanced).c_str());
            return base;
        }

        return intermediate.addMethod(base, TType(EbtInt), &field, loc);
    }

    // It's not .length() if we get to here.

    if (base->isArray()) {
        error(loc, "cannot apply to an array:", ".", field.c_str());

        return base;
    }

    if (base->getType().isCoopMat()) {
        error(loc, "cannot apply to a cooperative matrix type:", ".", field.c_str());
        return base;
    }

    // It's neither an array nor .length() if we get here,
    // leaving swizzles and struct/block dereferences.

    TIntermTyped* result = base;
    if ((base->isVector() || base->isScalar()) &&
        (base->isFloatingDomain() || base->isIntegerDomain() || base->getBasicType() == EbtBool)) {
        result = handleDotSwizzle(loc, base, field);
    } else if (base->isStruct() || base->isReference()) {
        const TTypeList* fields = base->isReference() ?
                                  base->getType().getReferentType()->getStruct() :
                                  base->getType().getStruct();
        bool fieldFound = false;
        int member;
        for (member = 0; member < (int)fields->size(); ++member) {
            if ((*fields)[member].type->getFieldName() == field) {
                fieldFound = true;
                break;
            }
        }

        if (fieldFound) {
            if (spvVersion.vulkan != 0 && spvVersion.vulkanRelaxed)
                result = vkRelaxedRemapDotDereference(loc, *base, *(*fields)[member].type, field);

            if (result == base)
            {
                if (base->getType().getQualifier().isFrontEndConstant())
                    result = intermediate.foldDereference(base, member, loc);
                else {
                    blockMemberExtensionCheck(loc, base, member, field);
                    TIntermTyped* index = intermediate.addConstantUnion(member, loc);
                    result = intermediate.addIndex(EOpIndexDirectStruct, base, index, loc);
                    result->setType(*(*fields)[member].type);
                    if ((*fields)[member].type->getQualifier().isIo())
                        intermediate.addIoAccessed(field);
                }
            }

            inheritMemoryQualifiers(base->getQualifier(), result->getWritableType().getQualifier());
        } else {
            auto baseSymbol = base;
            while (baseSymbol->getAsSymbolNode() == nullptr) {
                auto binaryNode = baseSymbol->getAsBinaryNode();
                if (binaryNode == nullptr) break;
                baseSymbol = binaryNode->getLeft();
            }
            if (baseSymbol->getAsSymbolNode() != nullptr) {
                TString structName;
                structName.append("\'").append(baseSymbol->getAsSymbolNode()->getName().c_str()).append("\'");
                error(loc, "no such field in structure", field.c_str(), structName.c_str());
            } else {
                error(loc, "no such field in structure", field.c_str(), "");
            }
        }
    } else
        error(loc, "does not apply to this type:", field.c_str(),
          base->getType().getCompleteString(intermediate.getEnhancedMsgs()).c_str());

    // Propagate noContraction up the dereference chain
    if (base->getQualifier().isNoContraction())
        result->getWritableType().getQualifier().setNoContraction();

    // Propagate nonuniform
    if (base->getQualifier().isNonUniform())
        result->getWritableType().getQualifier().nonUniform = true;

    return result;
}